

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

bool __thiscall Minisat::Solver::isSimplifyDuplicate(Solver *this,CRef cr)

{
  ulong *puVar1;
  uint uVar2;
  uint *puVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  long lVar6;
  int i;
  uint uVar7;
  unsigned_long uVar8;
  ulong uVar9;
  int i_1;
  ulong uVar10;
  
  uVar2 = (this->simplifyBuffer).ring.sz;
  lVar6 = (long)(int)uVar2;
  uVar5 = 0;
  if (lVar6 != 0) {
    puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
    puVar1 = (ulong *)(puVar3 + cr);
    uVar9 = 0;
    if (0 < (int)uVar2) {
      uVar9 = (ulong)uVar2;
    }
    for (; uVar9 != uVar5; uVar5 = uVar5 + 1) {
      uVar7 = (this->simplifyBuffer).ring.data[uVar5];
      if ((uVar7 != cr && uVar7 != 0xffffffff) &&
         ((*(ulong *)(puVar3 + uVar7) ^ *puVar1) >> 0x22 == 0)) {
        uVar9 = uVar5 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar9 != uVar2) {
      puVar4 = (this->seen2).data;
      uVar8 = this->counter + 1;
      this->counter = uVar8;
      for (uVar5 = 0; uVar5 < *puVar1 >> 0x22; uVar5 = uVar5 + 1) {
        puVar4[*(int *)((long)puVar1 + uVar5 * 4 + 8)] = uVar8;
      }
      for (; uVar5 = (ulong)((long)uVar9 < lVar6), (long)uVar9 < lVar6; uVar9 = uVar9 + 1) {
        uVar2 = (this->simplifyBuffer).ring.data[uVar9];
        if (uVar2 != cr && uVar2 != 0xffffffff) {
          uVar7 = (uint)(*(ulong *)(puVar3 + uVar2) >> 0x22);
          if ((uint)(*puVar1 >> 0x22) == uVar7) {
            uVar10 = 0;
            while( true ) {
              if (*(ulong *)(puVar3 + uVar2) >> 0x22 == uVar10) goto LAB_001159c7;
              if ((this->seen2).data[(int)puVar3[(ulong)uVar2 + uVar10 + 2]] != uVar8) break;
              uVar10 = uVar10 + 1;
            }
            if (uVar7 == (uint)uVar10) goto LAB_001159c7;
          }
        }
      }
    }
    uVar5 = 0;
  }
LAB_001159c7:
  return SUB81(uVar5,0);
}

Assistant:

int size(void) const { return sz; }